

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS14Features(Model *model)

{
  uint32 uVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  Pipeline *pPVar5;
  PipelineRegressor *pPVar6;
  WordTagger *pWVar7;
  PipelineClassifier *pPVar8;
  long lVar9;
  void **ppvVar10;
  bool bVar11;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar8 = Specification::Model::pipelineclassifier(model);
    pPVar5 = pPVar8->pipeline_;
    if (pPVar5 == (Pipeline *)0x0) {
      pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar10 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar9 = 0;
    do {
      bVar11 = (long)iVar2 * 8 == lVar9;
      bVar4 = !bVar11;
      if (bVar11) {
        return bVar4;
      }
      bVar11 = hasIOS14Features(*(Model **)((long)ppvVar10 + lVar9));
      lVar9 = lVar9 + 8;
    } while (!bVar11);
  }
  else if (uVar1 == 0xc9) {
    pPVar6 = Specification::Model::pipelineregressor(model);
    pPVar5 = pPVar6->pipeline_;
    if (pPVar5 == (Pipeline *)0x0) {
      pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar10 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar9 = 0;
    do {
      bVar11 = (long)iVar2 * 8 == lVar9;
      bVar4 = !bVar11;
      if (bVar11) {
        return bVar4;
      }
      bVar11 = hasIOS14Features(*(Model **)((long)ppvVar10 + lVar9));
      lVar9 = lVar9 + 8;
    } while (!bVar11);
  }
  else {
    bVar4 = true;
    if (uVar1 != 3000) {
      if (uVar1 == 0x7d1) {
        pWVar7 = Specification::Model::wordtagger(model);
        bVar4 = pWVar7->revision_ == 3;
      }
      else if (uVar1 == 0xca) {
        pPVar5 = Specification::Model::pipeline(model);
        pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
        ppvVar10 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar10 = (void **)0x0;
        }
        iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
        lVar9 = 0;
        do {
          bVar11 = (long)iVar2 * 8 == lVar9;
          bVar4 = !bVar11;
          if (bVar11) {
            return bVar4;
          }
          bVar11 = hasIOS14Features(*(Model **)((long)ppvVar10 + lVar9));
          lVar9 = lVar9 + 8;
        } while (!bVar11);
      }
      else {
        bVar11 = hasIOS14NeuralNetworkFeatures(model);
        if ((!bVar11) && (bVar11 = hasObjectPrint(model), !bVar11)) {
          bVar4 = hasFloat32InputsOrOutputsForNonmaxSuppression(model);
          return bVar4;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool CoreML::hasIOS14Features(const Specification::Model& model) {
    // New IOS14 features:
    // - new layers in Neural Network
    // - Non-zero values for optional inputs
    // - VisionFeaturePrint.Object
    // - Float32 input/output for Non-Maximum Suppression
    // - Apple Word Tagger using transfer learning (revision == 3)

    bool result = false;

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kSerializedModel:
            return true;
        case Specification::Model::kWordTagger:
            return model.wordtagger().revision() == 3;
        default:
            return (hasIOS14NeuralNetworkFeatures(model) || hasObjectPrint(model) || hasFloat32InputsOrOutputsForNonmaxSuppression(model));
    }
    return false;
}